

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O1

FragmentOutputLayout *
vkt::shaderexecutor::anon_unknown_0::computeFragmentOutputLayout
          (FragmentOutputLayout *__return_storage_ptr__,
          vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *symbols
          )

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  const_iterator cVar3;
  InternalError *this;
  pointer __k;
  int location;
  mapped_type_conflict local_44;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *local_40;
  pointer local_38;
  
  (__return_storage_ptr__->locationSymbols).
  super__Vector_base<const_vkt::shaderexecutor::Symbol_*,_std::allocator<const_vkt::shaderexecutor::Symbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->locationSymbols).
  super__Vector_base<const_vkt::shaderexecutor::Symbol_*,_std::allocator<const_vkt::shaderexecutor::Symbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->locationSymbols).
  super__Vector_base<const_vkt::shaderexecutor::Symbol_*,_std::allocator<const_vkt::shaderexecutor::Symbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(__return_storage_ptr__->locationMap)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->locationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->locationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->locationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->locationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->locationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_44 = 0;
  __k = (symbols->
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (__k != (symbols->
             super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    local_40 = symbols;
    do {
      iVar2 = glu::getDataTypeNumLocations((__k->varType).m_data.basic.type);
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&(__return_storage_ptr__->locationMap)._M_t,&__k->name);
      if ((_Rb_tree_header *)cVar3._M_node != p_Var1) {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this,(char *)0x0,"!de::contains(ret.locationMap, it->name)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
                   ,0x1e2);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      de::
      insert<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                (&__return_storage_ptr__->locationMap,&__k->name,&local_44);
      local_44 = local_44 + iVar2;
      if (0 < iVar2) {
        do {
          local_38 = __k;
          std::
          vector<vkt::shaderexecutor::Symbol_const*,std::allocator<vkt::shaderexecutor::Symbol_const*>>
          ::emplace_back<vkt::shaderexecutor::Symbol_const*>
                    ((vector<vkt::shaderexecutor::Symbol_const*,std::allocator<vkt::shaderexecutor::Symbol_const*>>
                      *)__return_storage_ptr__,&local_38);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      __k = __k + 1;
    } while (__k != (local_40->
                    super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

static FragmentOutputLayout computeFragmentOutputLayout (const std::vector<Symbol>& symbols)
{
	FragmentOutputLayout	ret;
	int						location	= 0;

	for (std::vector<Symbol>::const_iterator it = symbols.begin(); it != symbols.end(); ++it)
	{
		const int	numLocations	= glu::getDataTypeNumLocations(it->varType.getBasicType());

		TCU_CHECK_INTERNAL(!de::contains(ret.locationMap, it->name));
		de::insert(ret.locationMap, it->name, location);
		location += numLocations;

		for (int ndx = 0; ndx < numLocations; ++ndx)
			ret.locationSymbols.push_back(&*it);
	}

	return ret;
}